

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::sessionT11Fixture::createSession
          (sessionT11Fixture *this,int heartBtInt,int startDay,int endDay)

{
  Session *this_00;
  allocator<char> local_734;
  allocator<char> local_733;
  allocator<char> local_732;
  allocator<char> local_731;
  STRING local_730;
  STRING local_710;
  FieldBase local_6f0;
  string local_690;
  FieldBase local_670;
  TimeRange sessionTime;
  SessionID sessionID;
  DataDictionaryProvider provider;
  
  if (this->object != (Session *)0x0) {
    (**(code **)(*(long *)this->object + 8))();
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&sessionTime,"FIXT.1.1",&local_731);
  FIX::BeginString::BeginString((BeginString *)&provider,(STRING *)&sessionTime);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_730,"TW",&local_732);
  FIX::SenderCompID::SenderCompID((SenderCompID *)&local_6f0,&local_730);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_710,"ISLD",&local_733);
  FIX::TargetCompID::TargetCompID((TargetCompID *)&local_670,&local_710);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_690,"",&local_734);
  FIX::SessionID::SessionID
            (&sessionID,
             (string *)
             &provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_parent,&local_6f0.m_string,&local_670.m_string,&local_690);
  std::__cxx11::string::~string((string *)&local_690);
  FIX::FieldBase::~FieldBase(&local_670);
  std::__cxx11::string::~string((string *)&local_710);
  FIX::FieldBase::~FieldBase(&local_6f0);
  std::__cxx11::string::~string((string *)&local_730);
  FIX::FieldBase::~FieldBase((FieldBase *)&provider);
  std::__cxx11::string::~string((string *)&sessionTime);
  FIX::TimeRange::TimeRange
            (&sessionTime,&(this->super_TestCallback).startTime,&(this->super_TestCallback).endTime,
             startDay,endDay);
  FIX::DataDictionaryProvider::DataDictionaryProvider(&provider);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6f0,"../spec/FIXT11.xml",(allocator<char> *)&local_670);
  FIX::DataDictionaryProvider::addTransportDataDictionary
            (&provider,&sessionID.m_beginString,(string *)&local_6f0);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_670,"7",(allocator<char> *)&local_710);
  FIX::ApplVerID::ApplVerID((ApplVerID *)&local_6f0,(STRING *)&local_670);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_730,"../spec/FIX50.xml",(allocator<char> *)&local_690);
  FIX::DataDictionaryProvider::addApplicationDataDictionary
            (&provider,(ApplVerID *)&local_6f0,&local_730);
  std::__cxx11::string::~string((string *)&local_730);
  FIX::FieldBase::~FieldBase(&local_6f0);
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_670,"4",(allocator<char> *)&local_710);
  FIX::ApplVerID::ApplVerID((ApplVerID *)&local_6f0,(STRING *)&local_670);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_730,"../spec/FIX42.xml",(allocator<char> *)&local_690);
  FIX::DataDictionaryProvider::addApplicationDataDictionary
            (&provider,(ApplVerID *)&local_6f0,&local_730);
  std::__cxx11::string::~string((string *)&local_730);
  FIX::FieldBase::~FieldBase(&local_6f0);
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_670,"2",(allocator<char> *)&local_710);
  FIX::ApplVerID::ApplVerID((ApplVerID *)&local_6f0,(STRING *)&local_670);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_730,"../spec/FIX40.xml",(allocator<char> *)&local_690);
  FIX::DataDictionaryProvider::addApplicationDataDictionary
            (&provider,(ApplVerID *)&local_6f0,&local_730);
  std::__cxx11::string::~string((string *)&local_730);
  FIX::FieldBase::~FieldBase(&local_6f0);
  std::__cxx11::string::~string((string *)&local_670);
  this_00 = (Session *)operator_new(0x848);
  FIX::Session::Session
            (this_00,&(this->super_TestCallback).super_NullApplication.super_Application,
             (MessageStoreFactory *)&this->factory,&sessionID,&provider,&sessionTime,heartBtInt,
             (LogFactory *)0x0);
  this->object = this_00;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_730,"FIX.5.0",(allocator<char> *)&local_710);
  FIX::BeginString::BeginString((BeginString *)&local_670,&local_730);
  FIX::Message::toApplVerID((ApplVerID *)&local_6f0,(BeginString *)&local_670);
  std::__cxx11::string::_M_assign((string *)(this_00 + 0x1f8));
  FIX::FieldBase::~FieldBase(&local_6f0);
  FIX::FieldBase::~FieldBase(&local_670);
  std::__cxx11::string::~string((string *)&local_730);
  FIX::Session::setResponder(this->object,(Responder *)this);
  FIX::DataDictionaryProvider::~DataDictionaryProvider(&provider);
  FIX::SessionID::~SessionID(&sessionID);
  return;
}

Assistant:

virtual void createSession( int heartBtInt, int startDay = -1 , int endDay = -1 )
  {
    if( object )
      delete object;

    SessionID sessionID( BeginString( "FIXT.1.1" ),
                         SenderCompID( "TW" ), TargetCompID( "ISLD" ) );
    TimeRange sessionTime( startTime, endTime, startDay, endDay );

    DataDictionaryProvider provider;
    provider.addTransportDataDictionary( sessionID.getBeginString(), "../spec/FIXT11.xml" );
    provider.addApplicationDataDictionary( ApplVerID(ApplVerID_FIX50), "../spec/FIX50.xml" );
    provider.addApplicationDataDictionary( ApplVerID(ApplVerID_FIX42), "../spec/FIX42.xml" );
    provider.addApplicationDataDictionary( ApplVerID(ApplVerID_FIX40), "../spec/FIX40.xml" );

    object = new Session( *this, factory, sessionID, provider,
                           sessionTime, heartBtInt, 0 );
    object->setSenderDefaultApplVerID( FIX::Message::toApplVerID(BeginString("FIX.5.0")) );
    object->setResponder( this );
  }